

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::next(Session *this,UtcTimeStamp *now)

{
  function<FIX::UtcTimeStamp_()> *this_00;
  SessionState *this_01;
  int *piVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  allocator<char> local_39;
  string local_38;
  
  bVar2 = checkSessionTime(this,now);
  if (!bVar2) {
    reset(this);
    return;
  }
  if (((this->m_state).m_enabled != true) ||
     (bVar2 = TimeRange::isInRange(&this->m_logonTime,now), !bVar2)) {
    if ((this->m_state).m_receivedLogon != true) {
      return;
    }
    if (((this->m_state).m_sentLogon & 1U) == 0) {
      return;
    }
    if ((this->m_state).m_sentLogout == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Initiated logout request",&local_39);
      SessionState::onEvent(&this->m_state,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      SessionState::logoutReason_abi_cxx11_(&local_38,&this->m_state);
      generateLogout(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
  }
  this_01 = &this->m_state;
  if ((this->m_state).m_receivedLogon == false) {
    bVar3 = (this->m_state).m_sentLogon;
    bVar5 = (this->m_state).m_initiate;
    if (((~bVar5 | bVar3) & 1) == 0) {
      bVar2 = TimeRange::isInRange(&this->m_logonTime,now);
      if (bVar2) {
        generateLogon(this);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"Initiated logon request",&local_39);
        SessionState::onEvent(this_01,&local_38);
        goto LAB_001ad37e;
      }
      bVar3 = (this->m_state).m_sentLogon;
      bVar5 = (this->m_state).m_initiate;
    }
    if ((bVar5 & 1) == 0) {
      return;
    }
    if ((bVar3 & 1) == 0) {
      return;
    }
    std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_38,&this->m_timestamper);
    bVar2 = SessionState::logonTimedOut(this_01,(UtcTimeStamp *)&local_38);
    if (!bVar2) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Timed out waiting for logon response",&local_39);
    SessionState::onEvent(this_01,&local_38);
  }
  else {
    iVar4 = IntField::getValue(&(this->m_state).m_heartBtInt.super_IntField);
    if (iVar4 == 0) {
      return;
    }
    this_00 = &this->m_timestamper;
    std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_38,this_00);
    bVar2 = SessionState::logoutTimedOut(this_01,(UtcTimeStamp *)&local_38);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Timed out waiting for logout response",&local_39);
      SessionState::onEvent(this_01,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      disconnect(this);
    }
    std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_38,this_00);
    bVar2 = SessionState::withinHeartBeat(this_01,(UtcTimeStamp *)&local_38);
    if (bVar2) {
      return;
    }
    std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_38,this_00);
    bVar2 = SessionState::timedOut(this_01,(UtcTimeStamp *)&local_38);
    if (!bVar2) {
      std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_38,this_00);
      bVar2 = SessionState::needTestRequest(this_01,(UtcTimeStamp *)&local_38);
      if (!bVar2) {
        std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)&local_38,this_00);
        bVar2 = SessionState::needHeartbeat(this_01,(UtcTimeStamp *)&local_38);
        if (!bVar2) {
          return;
        }
        generateHeartbeat(this);
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"TEST",&local_39);
      generateTestRequest(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      piVar1 = &(this->m_state).m_testRequest;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Sent test request TEST",&local_39);
      SessionState::onEvent(this_01,&local_38);
LAB_001ad37e:
      std::__cxx11::string::~string((string *)&local_38);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Timed out waiting for heartbeat",&local_39);
    SessionState::onEvent(this_01,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  disconnect(this);
  return;
}

Assistant:

void Session::next(const UtcTimeStamp &now) {
  try {
    if (!checkSessionTime(now)) {
      reset();
      return;
    }

    if (!isEnabled() || !isLogonTime(now)) {
      if (isLoggedOn()) {
        if (!m_state.sentLogout()) {
          m_state.onEvent("Initiated logout request");
          generateLogout(m_state.logoutReason());
        }
      } else {
        return;
      }
    }

    if (!m_state.receivedLogon()) {
      if (m_state.shouldSendLogon() && isLogonTime(now)) {
        generateLogon();
        m_state.onEvent("Initiated logon request");
      } else if (m_state.alreadySentLogon() && m_state.logonTimedOut(m_timestamper())) {
        m_state.onEvent("Timed out waiting for logon response");
        disconnect();
      }
      return;
    }

    if (m_state.heartBtInt() == 0) {
      return;
    }

    if (m_state.logoutTimedOut(m_timestamper())) {
      m_state.onEvent("Timed out waiting for logout response");
      disconnect();
    }

    if (m_state.withinHeartBeat(m_timestamper())) {
      return;
    }

    if (m_state.timedOut(m_timestamper())) {
      m_state.onEvent("Timed out waiting for heartbeat");
      disconnect();
    } else {
      if (m_state.needTestRequest(m_timestamper())) {
        generateTestRequest("TEST");
        m_state.testRequest(m_state.testRequest() + 1);
        m_state.onEvent("Sent test request TEST");
      } else if (m_state.needHeartbeat(m_timestamper())) {
        generateHeartbeat();
      }
    }
  } catch (FIX::IOException &e) {
    m_state.onEvent(e.what());
    disconnect();
  }
}